

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expint_e1.c
# Opt level: O3

double xc_expint_e1_impl(double x,int scale)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar2 = x;
  if (701.8334146820821 <= x) {
    dVar2 = 701.8334146820821;
  }
  dVar4 = x;
  if (scale == 0) {
    dVar4 = dVar2;
  }
  if (dVar4 <= -10.0) {
    dVar3 = 1.0;
    if (scale == 0) {
      dVar3 = exp(-dVar2);
    }
    dVar7 = 20.0 / dVar4 + 1.0;
    uVar1 = 0x28;
    dVar2 = 0.0;
    dVar5 = 0.0;
    do {
      dVar6 = dVar5;
      dVar5 = dVar2;
      dVar2 = ((dVar7 + dVar7) * dVar5 - dVar6) + (double)(&DAT_00fbfc30)[uVar1];
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  else if (dVar4 <= -4.0) {
    dVar3 = 1.0;
    if (scale == 0) {
      dVar3 = exp(-dVar2);
    }
    dVar7 = (40.0 / dVar4 + 7.0) / 3.0;
    uVar1 = 0x1a;
    dVar2 = 0.0;
    dVar5 = 0.0;
    do {
      dVar6 = dVar5;
      dVar5 = dVar2;
      dVar2 = ((dVar7 + dVar7) * dVar5 - dVar6) + AE11_data[uVar1 + 0x26];
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  else {
    if (dVar4 <= -1.0) {
      if (scale == 0) {
        dVar2 = 1.0;
      }
      else {
        dVar2 = exp(x);
      }
      dVar5 = log(ABS(dVar4));
      dVar7 = (dVar4 + dVar4 + 5.0) / 3.0;
      uVar1 = 0x14;
      dVar4 = 0.0;
      dVar3 = 0.0;
      do {
        dVar6 = dVar3;
        dVar3 = dVar4;
        dVar4 = ((dVar7 + dVar7) * dVar3 - dVar6) + AE12_data[uVar1 + 0x18];
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
      return dVar2 * ((dVar4 - dVar6) * 0.5 - dVar5);
    }
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      xc_expint_e1_impl_cold_1();
      return 0.0;
    }
    dVar5 = 1.0;
    if (dVar4 <= 1.0) {
      if (scale != 0) {
        dVar5 = exp(x);
      }
      dVar7 = log(ABS(dVar4));
      uVar1 = 0x11;
      dVar2 = 0.0;
      dVar3 = 0.0;
      do {
        dVar6 = dVar2;
        dVar8 = ((dVar4 + dVar4) * dVar3 - dVar6) + E11_data[uVar1 + 0x12];
        uVar1 = uVar1 - 1;
        dVar2 = dVar3;
        dVar3 = dVar8;
      } while (1 < uVar1);
      dVar3 = (dVar8 - dVar6) * 0.5 + dVar4 + (-0.6875 - dVar7);
      goto LAB_00e7674c;
    }
    if (dVar4 <= 4.0) {
      dVar3 = 1.0;
      if (scale == 0) {
        dVar3 = exp(-dVar2);
      }
      dVar7 = (8.0 / dVar4 + -5.0) / 3.0;
      uVar1 = 0x1a;
      dVar2 = 0.0;
      dVar5 = 0.0;
      do {
        dVar6 = dVar5;
        dVar5 = dVar2;
        dVar2 = ((dVar7 + dVar7) * dVar5 - dVar6) + E12_data[uVar1 + 0xe];
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
    else {
      if ((scale == 0) && (701.8334146820821 < dVar4)) {
        fprintf(_stderr,"Argument %14.10le is larger than xmax=%14.10le in expint_e1\n",dVar2,
                0x4085eeaad5511c64);
        return 0.0;
      }
      dVar3 = 1.0;
      if (scale == 0) {
        dVar3 = exp(-dVar2);
      }
      dVar7 = 8.0 / dVar4 + -1.0;
      uVar1 = 0x1b;
      dVar2 = 0.0;
      dVar5 = 0.0;
      do {
        dVar6 = dVar5;
        dVar5 = dVar2;
        dVar2 = ((dVar7 + dVar7) * dVar5 - dVar6) + AE13_data[uVar1 + 0x18];
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
  }
  dVar3 = (1.0 / dVar4) * dVar3;
  dVar5 = (dVar2 - dVar6) * 0.5 + 1.0;
LAB_00e7674c:
  return dVar5 * dVar3;
}

Assistant:

GPU_FUNCTION double xc_expint_e1_impl(double x, const int scale){
  const double xmaxt = -LOG_DBL_MIN;        /* XMAXT = -log (R1MACH(1)) */
  const double xmax  = xmaxt - log(xmaxt);    /* XMAX = XMAXT - log(XMAXT) */

  double e1 = 0.0;

  /* this is a workaround not to have argument errors */
  if(! scale) x = m_min(x, xmax);

  if(x <= -10.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval(20.0/x + 1.0, AE11_data, 39));
  }else if(x <= -4.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval((40.0/x + 7.0)/3.0, AE12_data, 25));
  }else if(x <= -1.0){
    const double scale_factor = ( scale ? exp(x) : 1.0 );
    e1 = scale_factor * (-log(fabs(x)) + xc_cheb_eval((2.0*x + 5.0)/3.0, E11_data, 19));
  }else if(x == 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Argument cannot be 0.0 in expint_e1\n");
#endif
  }else if(x <= 1.0){
    const double scale_factor = ( scale ? exp(x) : 1.0 );
    e1 = scale_factor*(-log(fabs(x)) - 0.6875 + x + xc_cheb_eval(x, E12_data, 16));
  }else if(x <= 4.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval((8.0/x - 5.0)/3.0, AE13_data, 25));
  }else if(x <= xmax || scale){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval(8.0/x - 1.0, AE14_data, 26));
  }else{
#ifndef HAVE_CUDA
  fprintf(stderr, "Argument %14.10le is larger than xmax=%14.10le in expint_e1\n", x, xmax);
#endif
  }

  return e1;
}